

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

OperatorResultType
duckdb::RangeFunction<false>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  hugeint_t *increment_00;
  LocalTableFunctionState *pLVar1;
  _func_int **pp_Var2;
  unsigned_long *puVar3;
  pointer pVVar4;
  pointer pVVar5;
  undefined1 auVar6 [16];
  DataChunk *pDVar7;
  int64_t start;
  ulong uVar8;
  bool bVar9;
  reference pvVar10;
  InternalException *this;
  BinderException *this_00;
  size_type sVar11;
  idx_t iVar12;
  LocalTableFunctionState *pLVar13;
  idx_t entry_idx;
  hugeint_t *start_00;
  hugeint_t *rhs;
  hugeint_t hVar14;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t increment;
  int64_t current_value_i64;
  hugeint_t current_value;
  hugeint_t end;
  string local_f8;
  hugeint_t *local_d0;
  LocalTableFunctionState *local_c8;
  DataChunk *local_c0;
  hugeint_t *local_b8;
  hugeint_t local_b0;
  int64_t local_a0;
  hugeint_t local_98;
  hugeint_t local_88 [2];
  hugeint_t local_68;
  ulong local_58;
  hugeint_t local_50;
  hugeint_t local_40;
  
  local_c0 = output;
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar1 = (data_p->local_state).ptr;
  start_00 = (hugeint_t *)(pLVar1 + 4);
  rhs = (hugeint_t *)(pLVar1 + 6);
  increment_00 = (hugeint_t *)(pLVar1 + 8);
  pLVar13 = pLVar1;
  local_d0 = start_00;
  local_c8 = pLVar1;
  local_b8 = rhs;
  if (((ulong)pLVar1[1]._vptr_LocalTableFunctionState & 1) != 0) goto LAB_00a5842a;
  do {
    pp_Var2 = pLVar13[2]._vptr_LocalTableFunctionState;
    if ((_func_int **)input->count <= pp_Var2) {
      pLVar13[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
      *(undefined1 *)&pLVar13[1]._vptr_LocalTableFunctionState = 0;
      return NEED_MORE_INPUT;
    }
    DataChunk::Flatten(input);
    if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar12 = 0;
    }
    else {
      sVar11 = 0;
      do {
        pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar11);
        pLVar13 = local_c8;
        start_00 = local_d0;
        puVar3 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) &&
           ((puVar3[(ulong)pp_Var2 >> 6] & 1L << ((byte)pp_Var2 & 0x3f)) == 0)) {
          hugeint_t::hugeint_t((hugeint_t *)&local_f8,0);
          start_00 = local_d0;
          local_d0->lower = (uint64_t)local_f8._M_dataplus._M_p;
          local_d0->upper = local_f8._M_string_length;
          hugeint_t::hugeint_t((hugeint_t *)&local_f8,0);
          rhs = local_b8;
          local_b8->lower = (uint64_t)local_f8._M_dataplus._M_p;
          local_b8->upper = local_f8._M_string_length;
          hugeint_t::hugeint_t((hugeint_t *)&local_f8,1);
          increment_00->lower = (uint64_t)local_f8._M_dataplus._M_p;
          pLVar1[9]._vptr_LocalTableFunctionState = (_func_int **)local_f8._M_string_length;
          pLVar13 = local_c8;
          goto LAB_00a5841b;
        }
        sVar11 = sVar11 + 1;
        pVVar4 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar5 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar12 = ((long)pVVar5 - (long)pVVar4 >> 3) * 0x4ec4ec4ec4ec4ec5;
      } while (sVar11 < iVar12);
      if (pVVar5 != pVVar4) {
        sVar11 = 0;
        do {
          if (sVar11 == 3) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,"Unsupported parameter count for range function","");
            InternalException::InternalException(this,&local_f8);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar11);
          (&local_88[0].lower)[sVar11] = *(uint64_t *)(pvVar10->data + (long)pp_Var2 * 8);
          sVar11 = sVar11 + 1;
          iVar12 = ((long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        } while (sVar11 < iVar12);
      }
    }
    rhs = local_b8;
    GetParameters((int64_t *)local_88,iVar12,start_00,local_b8,increment_00);
    hugeint_t::hugeint_t((hugeint_t *)&local_f8,0);
    bVar9 = hugeint_t::operator==(increment_00,(hugeint_t *)&local_f8);
    if (bVar9) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"interval cannot be 0!","");
      BinderException::BinderException(this_00,&local_f8);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar9 = hugeint_t::operator>(start_00,rhs);
    if (bVar9) {
      hugeint_t::hugeint_t((hugeint_t *)&local_f8,0);
      bVar9 = hugeint_t::operator>(increment_00,(hugeint_t *)&local_f8);
      if (bVar9) {
        *(undefined1 *)&pLVar13[10]._vptr_LocalTableFunctionState = 1;
      }
    }
    bVar9 = hugeint_t::operator<(start_00,rhs);
    if (bVar9) {
      hugeint_t::hugeint_t((hugeint_t *)&local_f8,0);
      bVar9 = hugeint_t::operator<(increment_00,(hugeint_t *)&local_f8);
      if (bVar9) {
        *(undefined1 *)&pLVar13[10]._vptr_LocalTableFunctionState = 1;
      }
    }
LAB_00a5841b:
    *(undefined1 *)&pLVar13[1]._vptr_LocalTableFunctionState = 1;
    pLVar13[3]._vptr_LocalTableFunctionState = (_func_int **)0x0;
LAB_00a5842a:
    if (*(char *)&pLVar13[10]._vptr_LocalTableFunctionState == '\x01') {
      local_c0->count = 0;
      pLVar13[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar13[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar13[1]._vptr_LocalTableFunctionState = 0;
      return HAVE_MORE_OUTPUT;
    }
    local_f8._M_dataplus._M_p = (pointer)increment_00->lower;
    local_f8._M_string_length = (size_type)pLVar1[9]._vptr_LocalTableFunctionState;
    local_88[0].lower = rhs->lower;
    local_88[0].upper = rhs->upper;
    hugeint_t::hugeint_t(&local_68,(int64_t)pLVar13[3]._vptr_LocalTableFunctionState);
    local_b0 = hugeint_t::operator*((hugeint_t *)&local_f8,&local_68);
    local_98 = hugeint_t::operator+(start_00,&local_b0);
    hVar14.upper = (int64_t)&local_a0;
    hVar14.lower = local_98.upper;
    bVar9 = Hugeint::TryCast<long>((Hugeint *)local_98.lower,hVar14,&local_a0);
    if (bVar9) {
      hugeint_t::hugeint_t(&local_b0,0);
      bVar9 = hugeint_t::operator<((hugeint_t *)&local_f8,&local_b0);
      local_68 = hugeint_t::operator-(local_88,&local_98);
      hugeint_t::hugeint_t(&local_50,(ulong)bVar9 - 1 | 1);
      local_40 = hugeint_t::operator+((hugeint_t *)&local_f8,&local_50);
      local_b0 = hugeint_t::operator+(&local_68,&local_40);
      hVar14 = hugeint_t::operator/(&local_b0,(hugeint_t *)&local_f8);
      local_58 = 0;
      input_00.upper = (int64_t)&local_58;
      input_00.lower = hVar14.upper;
      Hugeint::TryCast<unsigned_long>((Hugeint *)hVar14.lower,input_00,(uint64_t *)0x0);
      uVar8 = local_58;
      pDVar7 = local_c0;
      iVar12 = 0x800;
      if (local_58 < 0x800) {
        iVar12 = local_58;
      }
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&local_c0->data,0);
      start = local_a0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_b0.upper;
      local_b0 = (hugeint_t)(auVar6 << 0x40);
      input_01.upper = (int64_t)&local_b0;
      input_01.lower = local_f8._M_string_length;
      Hugeint::TryCast<long>((Hugeint *)local_f8._M_dataplus._M_p,input_01,(int64_t *)0x0);
      pLVar13 = local_c8;
      Vector::Sequence(pvVar10,start,local_b0.lower,iVar12);
      pLVar13[3]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar13[3]._vptr_LocalTableFunctionState + iVar12);
      pDVar7->count = iVar12;
      if (uVar8 != 0) {
        return HAVE_MORE_OUTPUT;
      }
      pLVar13[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar13[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar13[1]._vptr_LocalTableFunctionState = 0;
      start_00 = local_d0;
    }
    else {
      pLVar13[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar13[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar13[1]._vptr_LocalTableFunctionState = 0;
    }
  } while( true );
}

Assistant:

static OperatorResultType RangeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                        DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeFunctionLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_idx = 0;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		auto increment = state.increment;
		auto end = state.end;
		hugeint_t current_value = state.start + increment * UnsafeNumericCast<int64_t>(state.current_idx);
		int64_t current_value_i64;
		if (!Hugeint::TryCast<int64_t>(current_value, current_value_i64)) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		int64_t offset = increment < 0 ? 1 : -1;
		idx_t remaining = MinValue<idx_t>(
		    Hugeint::Cast<idx_t>((end - current_value + (increment + offset)) / increment), STANDARD_VECTOR_SIZE);
		// set the result vector as a sequence vector
		output.data[0].Sequence(current_value_i64, Hugeint::Cast<int64_t>(increment), remaining);
		// increment the index pointer by the remaining count
		state.current_idx += remaining;
		output.SetCardinality(remaining);
		if (remaining == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}